

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustring.cpp
# Opt level: O0

UChar * u_memset_63(UChar *dest,UChar c,int32_t count)

{
  UChar *limit;
  UChar *ptr;
  int32_t count_local;
  UChar c_local;
  UChar *dest_local;
  
  if (0 < count) {
    limit = dest;
    while (limit < dest + count) {
      *limit = c;
      limit = limit + 1;
    }
  }
  return dest;
}

Assistant:

U_CAPI UChar * U_EXPORT2
u_memset(UChar *dest, UChar c, int32_t count) {
    if(count > 0) {
        UChar *ptr = dest;
        UChar *limit = dest + count;

        while (ptr < limit) {
            *(ptr++) = c;
        }
    }
    return dest;
}